

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

Gia_Man_t * Of_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Flt_t *pVVar1;
  Of_Obj_t *pOVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Of_Man_t *p;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  Jf_Par_t *pJVar9;
  float fVar10;
  
  pGVar4 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar4 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  p = Of_StoCreate(pGVar4,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar4);
    putchar(10);
  }
  Of_ManPrintInit(p);
  Of_ManComputeCuts(p);
  Of_ManPrintQuit(p);
  pGVar5 = p->pGia;
  for (lVar8 = 0; lVar8 < pGVar5->vCis->nSize; lVar8 = lVar8 + 1) {
    pObj = Gia_ManCi(pGVar5,(int)lVar8);
    iVar3 = Gia_ObjId(pGVar5,pObj);
    if (iVar3 == 0) break;
    pVVar1 = pGVar5->vInArrs;
    if (pVVar1 == (Vec_Flt_t *)0x0) {
      iVar6 = 0;
    }
    else {
      if (pVVar1->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar10 = 0.0;
      if (0.0 <= pVVar1->pArray[lVar8]) {
        fVar10 = pVVar1->pArray[lVar8];
      }
      iVar6 = (int)(fVar10 * 10.0);
    }
    pOVar2 = p->pObjs;
    pOVar2[iVar3].Delay1 = iVar6;
    pOVar2[iVar3].Delay2 = iVar6;
  }
  pJVar9 = p->pPars;
  if (pJVar9->nFastEdges == 0) {
    iVar3 = 0;
    while( true ) {
      p->Iter = iVar3;
      iVar6 = pJVar9->nRounds;
      if (iVar6 <= iVar3) break;
      Of_ManComputeForward1(p);
      Of_ManComputeBackward1(p);
      pcVar7 = "Flow ";
      if (iVar3 == 0) {
        pcVar7 = "Delay";
      }
      Of_ManPrintStats(p,pcVar7);
      iVar3 = iVar3 + 1;
    }
    while (iVar6 = iVar6 + pJVar9->nRoundsEla, iVar3 < iVar6) {
      if (iVar3 < iVar6 + -1) {
        Of_ManComputeForward2(p);
      }
      else {
        Of_ManComputeForward1(p);
      }
      Of_ManComputeBackward3(p);
      Of_ManPrintStats(p,"Area ");
      iVar3 = p->Iter + 1;
      p->Iter = iVar3;
      pJVar9 = p->pPars;
      iVar6 = pJVar9->nRounds;
    }
  }
  else {
    pJVar9->nRounds = 1;
    iVar3 = 1;
    for (iVar6 = 0; p->Iter = iVar6, iVar6 < iVar3; iVar6 = iVar6 + 1) {
      Of_ManComputeForwardDircon1(p);
      Of_ManComputeBackwardDircon1(p);
      pcVar7 = "Flow ";
      if (iVar6 == 0) {
        pcVar7 = "Delay";
      }
      Of_ManPrintStats(p,pcVar7);
      iVar3 = pJVar9->nRounds;
    }
  }
  pGVar5 = Of_ManDeriveMapping(p);
  Gia_ManMappingVerify(pGVar5);
  if (pGVar5->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManConvertPackingToEdges(pGVar5);
  }
  Of_StoDelete(p);
  if (pGVar4 != pGia) {
    Gia_ManStop(pGVar4);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Of_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Of_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0, pPars->fCutMin = 1; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Of_StoCreate( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Of_ManPrintInit( p );
    Of_ManComputeCuts( p );
    Of_ManPrintQuit( p );

    Gia_ManForEachCiId( p->pGia, Id, i )
    {
        int Time = Of_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0);
        Of_ObjSetDelay1( p, Id, Time );
        Of_ObjSetDelay2( p, Id, Time );
    }

    if ( p->pPars->nFastEdges )
    {
        p->pPars->nRounds = 1;
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
    }
    else
    {
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
        for ( ; p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla; p->Iter++ )
        {
            if ( p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla - 1 )
            {
                Of_ManComputeForward2( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
            else
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
        }
    }

    pNew = Of_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    if ( pNew->vPacking )
        Gia_ManConvertPackingToEdges( pNew );
    //Of_ManPrintCuts( p );
    Of_StoDelete( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    if ( pNew == NULL )
        return Gia_ManDup( pGia );
    return pNew;
}